

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::SMSFetcher<(TI::TMS::Personality)3>::fetch_tile_name
          (SMSFetcher<(TI::TMS::Personality)3> *this,int column)

{
  byte bVar1;
  iterator pvVar2;
  reference pvVar3;
  byte *pbVar4;
  size_type __n;
  RowInfo *local_48;
  value_type *line_buffer;
  size_t address;
  size_t scrolled_column;
  RowInfo *row_info;
  int column_local;
  SMSFetcher<(TI::TMS::Personality)3> *this_local;
  
  if (column < 0x18) {
    local_48 = &this->scrolled_row_info;
  }
  else {
    local_48 = &this->static_row_info;
  }
  __n = (ulong)local_48->pattern_address_base +
        (long)(int)(column - this->horizontal_offset & 0x1f) * 2;
  pvVar2 = this->base->fetch_line_buffer_;
  pvVar3 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,__n + 1);
  (pvVar2->field_5).bitmap[column] = *pvVar3;
  bVar1 = (pvVar2->field_5).bitmap[column];
  pbVar4 = std::array<unsigned_char,_16384UL>::operator[](&this->base->ram_,__n);
  this->base->tile_offset_ =
       ((bVar1 & 1) << 8 | (ushort)*pbVar4) * 0x20 +
       local_48->sub_row[(int)((pvVar2->field_5).bitmap[column] & 4) >> 2];
  return;
}

Assistant:

void fetch_tile_name(int column) {
		const RowInfo &row_info = column < 24 ? scrolled_row_info : static_row_info;
		const size_t scrolled_column = (column - horizontal_offset) & 0x1f;
		const size_t address = row_info.pattern_address_base + (scrolled_column << 1);
		auto &line_buffer = *base->fetch_line_buffer_;

		line_buffer.tiles.flags[column] = base->ram_[address+1];
		base->tile_offset_ = AddressT(
			(((line_buffer.tiles.flags[column]&1) << 8) | base->ram_[address]) << 5
		) + row_info.sub_row[(line_buffer.tiles.flags[column]&4) >> 2];
	}